

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall Runtime::setVar(Runtime *this,string *name,Data *data)

{
  Data *pDVar1;
  long lVar2;
  _Fwd_list_node_base *p_Var3;
  
  p_Var3 = (this->varEnvs).super__Fwd_list_base<VarEnv_*,_std::allocator<VarEnv_*>_>._M_impl._M_head
           ._M_next;
  do {
    if ((VarEnv *)p_Var3[1]._M_next == (VarEnv *)0x0) {
      p_Var3 = p_Var3->_M_next;
      pDVar1 = (Data *)0x0;
    }
    else {
      pDVar1 = VarEnv::getVar((VarEnv *)p_Var3[1]._M_next,name);
    }
  } while (pDVar1 == (Data *)0x0);
  lVar2 = __dynamic_cast(pDVar1,&Data::typeinfo,&Integer::typeinfo,0);
  if (lVar2 != 0) {
    pDVar1[1]._vptr_Data = data[1]._vptr_Data;
  }
  return;
}

Assistant:

void Runtime::setVar(std::string &name, Data *data) {
    auto target = getVar(name);
    if ((dynamic_cast<Integer *>(target)) != NULL) {
        ((Integer *) target)->value = ((Integer *) data)->value;
    }
}